

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O1

exr_result_t LossyDctEncoder_execute(LossyDctEncoder *e)

{
  DctCoderChannelData *pDVar1;
  long lVar2;
  uint16_t *puVar3;
  float *data;
  uint uVar4;
  char cVar5;
  int i;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  ushort *puVar10;
  uint uVar11;
  ulong uVar12;
  unsigned_short uVar13;
  int iVar14;
  ushort uVar15;
  ushort *puVar16;
  int y;
  float fVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  unsigned_short *puVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  int x;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  DctCoderChannelData *chanData [3];
  uint16_t halfZigCoef [64];
  uint16_t halfCoef [64];
  ulong local_1b0 [5];
  void *local_188;
  ulong local_180;
  ulong local_178;
  long local_170;
  long local_168;
  long local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ushort local_138 [64];
  unsigned_short auStack_b8 [68];
  
  iVar22 = e->_width;
  iVar20 = e->_channel_encode_data_count;
  uVar26 = (ulong)iVar20;
  iVar24 = e->_height;
  fVar28 = ceilf((float)iVar22 * 0.125);
  fVar29 = ceilf((float)iVar24 * 0.125);
  puVar16 = (ushort *)e->_packedAc;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  if (uVar26 == 0) {
    iVar6 = 0;
  }
  else {
    uVar12 = 0;
    iVar6 = 0;
    do {
      pDVar1 = e->_channel_encode_data[uVar12];
      local_1b0[uVar12 + 1] = (ulong)pDVar1;
      iVar14 = 0;
      if (pDVar1->_type == EXR_PIXEL_FLOAT) {
        iVar14 = iVar24 * iVar22;
      }
      iVar6 = iVar6 + iVar14;
      uVar12 = uVar12 + 1;
    } while ((uVar12 & 0xffffffff) < uVar26);
  }
  local_1b0[0] = uVar26;
  if (iVar6 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = internal_exr_alloc((long)iVar6 * 2);
    if (pvVar9 == (void *)0x0) {
      return 1;
    }
  }
  local_188 = pvVar9;
  if (iVar20 != 0) {
    uVar12 = 0;
    do {
      uVar26 = local_1b0[uVar12 + 1];
      if ((*(int *)(uVar26 + 0x198) == 2) && (iVar22 = e->_height, 0 < (long)iVar22)) {
        uVar7 = e->_width;
        lVar23 = 0;
        do {
          lVar18 = *(long *)(uVar26 + 0x180);
          if (0 < (int)uVar7) {
            lVar2 = *(long *)(lVar18 + lVar23 * 8);
            uVar27 = 0;
            do {
              fVar17 = *(float *)(lVar2 + uVar27 * 4);
              fVar30 = 65504.0;
              if ((fVar17 <= 65504.0) && (fVar30 = fVar17, fVar17 < -65504.0)) {
                fVar30 = -65504.0;
              }
              fVar17 = ABS(fVar30);
              uVar15 = (ushort)((uint)fVar30 >> 0x10) & 0x8000;
              if ((uint)fVar17 < 0x38800000) {
                if ((0x33000000 < (uint)fVar17) &&
                   (uVar8 = (uint)fVar30 & 0x7fffff | 0x800000, cVar5 = (char)((uint)fVar17 >> 0x17)
                   , uVar15 = uVar15 | (ushort)(uVar8 >> (0x7eU - cVar5 & 0x1f)),
                   0x80000000 < uVar8 << (cVar5 + 0xa2U & 0x1f))) {
                  uVar15 = uVar15 + 1;
                }
              }
              else if ((uint)fVar17 < 0x7f800000) {
                if ((uint)fVar17 < 0x477ff000) {
                  uVar15 = (ushort)((int)fVar17 + 0x8000fff + (uint)(((uint)fVar17 >> 0xd & 1) != 0)
                                   >> 0xd) | uVar15;
                }
                else {
                  uVar15 = uVar15 | 0x7c00;
                }
              }
              else {
                uVar15 = uVar15 | 0x7c00;
                if (fVar17 != INFINITY) {
                  uVar8 = (uint)fVar17 >> 0xd & 0x3ff;
                  uVar15 = uVar15 | (ushort)uVar8 | (ushort)(uVar8 == 0);
                }
              }
              *(ushort *)((long)pvVar9 + uVar27 * 2) = uVar15;
              uVar27 = uVar27 + 1;
            } while (uVar7 != uVar27);
          }
          *(void **)(lVar18 + lVar23 * 8) = pvVar9;
          pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar7 * 2);
          lVar23 = lVar23 + 1;
        } while (lVar23 != iVar22);
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      uVar26 = local_1b0[0];
    } while (uVar12 < local_1b0[0]);
  }
  uVar7 = (uint)fVar28;
  uVar8 = (uint)fVar29;
  local_170 = local_1b0[1];
  *(uint8_t **)(local_1b0[1] + 0x1a0) = e->_packedDc;
  if (1 < (uint)uVar26) {
    uVar12 = 1;
    do {
      *(long *)(local_1b0[uVar12 + 1] + 0x1a0) =
           *(long *)(local_1b0[uVar12] + 0x1a0) + (long)(int)(uVar8 * uVar7) * 2;
      uVar12 = uVar12 + 1;
    } while (uVar26 != uVar12);
  }
  if (0 < (int)uVar8) {
    local_180 = (ulong)uVar8;
    local_158 = (ulong)uVar7;
    uVar12 = 0;
    do {
      local_178 = uVar12;
      if (0 < (int)uVar7) {
        local_160 = local_1b0[2];
        local_168 = local_1b0[3];
        local_140 = (ulong)(uint)((int)uVar12 * 8);
        uVar12 = 0;
        do {
          uVar27 = local_1b0[0];
          local_150 = uVar12;
          if ((int)uVar26 != 0) {
            uVar8 = (int)uVar12 * 8;
            iVar22 = e->_width;
            iVar20 = e->_height;
            puVar3 = e->_toNonlinear;
            uVar26 = 0;
            do {
              local_148 = uVar26;
              uVar12 = local_1b0[uVar26 + 1];
              lVar23 = *(long *)(uVar12 + 0x180);
              lVar18 = 0;
              do {
                uVar11 = (int)local_140 + (int)lVar18;
                uVar19 = ~uVar11 + iVar20 * 2;
                if ((int)uVar11 < iVar20) {
                  uVar19 = uVar11;
                }
                if ((int)uVar19 < 0) {
                  uVar19 = iVar20 - 1;
                }
                lVar2 = *(long *)(lVar23 + (long)(int)uVar19 * 8);
                lVar25 = 0;
                iVar24 = ~uVar8 + iVar22 * 2;
                do {
                  iVar6 = uVar8 + (int)lVar25;
                  if (iVar22 <= iVar6) {
                    iVar6 = iVar24;
                  }
                  if (iVar6 < 0) {
                    iVar6 = iVar22 + -1;
                  }
                  uVar15 = *(ushort *)(lVar2 + (long)iVar6 * 2);
                  if (puVar3 != (uint16_t *)0x0) {
                    uVar15 = puVar3[uVar15];
                  }
                  uVar11 = (uVar15 & 0x7fff) << 0xd;
                  uVar19 = (int)(short)uVar15 & 0x80000000;
                  if (uVar11 < 0x800000) {
                    if ((uVar15 & 0x7fff) != 0) {
                      uVar4 = 0x1f;
                      if ((uVar15 & 0x7fff) != 0) {
                        for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                        }
                      }
                      iVar6 = (uVar4 ^ 0x1f) - 8;
                      uVar19 = (uVar19 | uVar11 << ((byte)iVar6 & 0x1f) | 0x38800000) +
                               iVar6 * -0x800000;
                    }
                  }
                  else if (uVar11 < 0xf800000) {
                    uVar19 = (uVar19 | uVar11) + 0x38000000;
                  }
                  else {
                    uVar19 = uVar19 | uVar11 | 0x7f800000;
                  }
                  *(uint *)(uVar12 + lVar25 * 4) = uVar19;
                  lVar25 = lVar25 + 1;
                  iVar24 = iVar24 + -1;
                } while (lVar25 != 8);
                lVar18 = lVar18 + 1;
                uVar12 = uVar12 + 0x20;
              } while (lVar18 != 8);
              uVar26 = uVar26 + 1;
            } while (uVar26 != local_1b0[0]);
            uVar26 = uVar27;
            if ((int)local_1b0[0] != 0) {
              if ((int)local_1b0[0] == 3) {
                lVar23 = 0;
                do {
                  fVar28 = *(float *)(local_170 + lVar23 * 4);
                  fVar29 = *(float *)(local_160 + lVar23 * 4);
                  fVar17 = *(float *)(local_168 + lVar23 * 4);
                  *(float *)(local_170 + lVar23 * 4) =
                       fVar17 * 0.0722 + fVar28 * 0.2126 + fVar29 * 0.7152;
                  *(float *)(local_160 + lVar23 * 4) =
                       fVar17 * 0.5 + fVar28 * -0.1146 + fVar29 * -0.3854;
                  *(float *)(local_168 + lVar23 * 4) =
                       fVar17 * -0.0458 + fVar28 * 0.5 + fVar29 * -0.4542;
                  lVar23 = lVar23 + 1;
                } while (lVar23 != 0x40);
              }
              lVar23 = 0x50;
              uVar12 = 0;
              do {
                data = (float *)local_1b0[uVar12 + 1];
                dctForward8x8(data);
                lVar18 = 0;
                do {
                  fVar28 = data[lVar18];
                  fVar29 = ABS(fVar28);
                  uVar8 = (uint)fVar28 >> 0x10 & 0x8000;
                  if ((uint)fVar29 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar29) &&
                       (uVar19 = (uint)fVar28 & 0x7fffff | 0x800000,
                       cVar5 = (char)((uint)fVar29 >> 0x17),
                       uVar8 = uVar8 | uVar19 >> (0x7eU - cVar5 & 0x1f),
                       0x80000000 < uVar19 << (cVar5 + 0xa2U & 0x1f))) {
                      uVar8 = uVar8 + 1;
                    }
                  }
                  else if ((uint)fVar29 < 0x7f800000) {
                    if ((uint)fVar29 < 0x477ff000) {
                      uVar8 = (int)fVar29 + 0x8000fff + (uint)(((uint)fVar29 >> 0xd & 1) != 0) >>
                              0xd | uVar8;
                    }
                    else {
                      uVar8 = uVar8 | 0x7c00;
                    }
                  }
                  else {
                    uVar8 = uVar8 | 0x7c00;
                    if (fVar29 != INFINITY) {
                      uVar19 = (uint)fVar29 >> 0xd & 0x3ff;
                      uVar8 = uVar8 | uVar19 | (uint)(uVar19 == 0);
                    }
                  }
                  uVar19 = uVar8 & 0xffff;
                  uVar13 = (unsigned_short)uVar8;
                  if ((uint)*(ushort *)(countSetBits_numBitsSet + (ulong)(uVar19 >> 8) * 2) +
                      (uint)*(ushort *)(countSetBits_numBitsSet + ((ulong)uVar19 & 0xff) * 2) != 0)
                  {
                    puVar21 = closestData + closestDataOffset[uVar19];
                    iVar22 = (uint)*(ushort *)(countSetBits_numBitsSet + (ulong)(uVar19 >> 8) * 2) +
                             (uint)*(ushort *)(countSetBits_numBitsSet + ((ulong)uVar19 & 0xff) * 2)
                             + 1;
                    do {
                      uVar19 = (uint)(short)*puVar21;
                      uVar11 = (uVar19 & 0x7fff) << 0xd;
                      fVar29 = (float)(uVar19 & 0x80000000);
                      if (uVar11 < 0x800000) {
                        if ((uVar19 & 0x7fff) != 0) {
                          uVar4 = 0x1f;
                          if ((uVar19 & 0x7fff) != 0) {
                            for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
                            }
                          }
                          iVar20 = (uVar4 ^ 0x1f) - 8;
                          fVar29 = (float)(((uint)fVar29 | uVar11 << ((byte)iVar20 & 0x1f) |
                                           0x38800000) + iVar20 * -0x800000);
                        }
                      }
                      else if (uVar11 < 0xf800000) {
                        fVar29 = (float)(((uint)fVar29 | uVar11) + 0x38000000);
                      }
                      else {
                        fVar29 = (float)((uint)fVar29 | uVar11 | 0x7f800000);
                      }
                      uVar13 = *puVar21;
                      if (ABS(fVar29 - fVar28) <
                          *(float *)((long)e->_channel_encode_data + lVar18 * 4 + lVar23 + -0x20))
                      break;
                      puVar21 = puVar21 + 1;
                      iVar22 = iVar22 + -1;
                      uVar13 = (unsigned_short)uVar8;
                    } while (1 < iVar22);
                  }
                  auStack_b8[lVar18] = uVar13;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0x40);
                puVar10 = local_138;
                lVar23 = 0;
                do {
                  *puVar10 = auStack_b8[*(int *)((long)&toZigZag_remap + lVar23)];
                  lVar23 = lVar23 + 4;
                  puVar10 = puVar10 + 1;
                } while (lVar23 != 0x100);
                puVar10 = *(ushort **)(data + 0x68);
                *(ushort **)(data + 0x68) = puVar10 + 1;
                *puVar10 = local_138[0];
                e->_numDcComp = e->_numDcComp + 1;
                iVar22 = 1;
                do {
                  if (local_138[iVar22] == 0) {
                    iVar20 = iVar22 + 1;
                    if (iVar22 < 0x3f) {
                      iVar24 = 0x40 - iVar22;
                      lVar23 = 0;
                      do {
                        iVar6 = (int)lVar23;
                        if (local_138[iVar20 + iVar6] != 0) {
                          iVar20 = iVar20 + iVar6;
                          iVar24 = iVar6 + 1;
                          goto LAB_0010d8e5;
                        }
                        lVar23 = lVar23 + 1;
                      } while (0x3f - (long)iVar22 != lVar23);
                      iVar20 = 0x40;
                    }
                    else {
                      iVar24 = 1;
                    }
LAB_0010d8e5:
                    uVar15 = 0;
                    iVar6 = 1;
                    if ((iVar24 != 1) && (uVar15 = 0xff00, iVar6 = iVar24, iVar20 != 0x40)) {
                      uVar15 = (ushort)iVar24 | 0xff00;
                    }
                    *puVar16 = uVar15;
                    e->_numAcComp = e->_numAcComp + 1;
                    iVar22 = iVar6 + iVar22;
                  }
                  else {
                    *puVar16 = local_138[iVar22];
                    e->_numAcComp = e->_numAcComp + 1;
                    iVar22 = iVar22 + 1;
                  }
                  puVar16 = puVar16 + 1;
                } while (iVar22 < 0x40);
                uVar12 = uVar12 + 1;
                lVar23 = 0x150;
              } while (uVar12 != uVar27);
            }
          }
          uVar12 = local_150 + 1;
        } while (uVar12 != local_158);
      }
      uVar12 = local_178 + 1;
    } while (uVar12 != local_180);
  }
  if (local_188 != (void *)0x0) {
    internal_exr_free(local_188);
  }
  return 0;
}

Assistant:

exr_result_t
LossyDctEncoder_execute (LossyDctEncoder* e)
{
    size_t               numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) ceilf ((float) e->_width / 8.0f);
    int numBlocksY = (int) ceilf ((float) e->_height / 8.0f);

    uint16_t halfZigCoef[64];
    uint16_t halfCoef[64];

    uint16_t* currAcComp = (uint16_t*) e->_packedAc;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //
    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    uint16_t* tmpHalfBuffer    = NULL;
    uint16_t* tmpHalfBufferPtr = NULL;
    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) internal_exr_alloc (
            tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (size_t chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t h;

            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            const float* quantTable = e->_quantTableY;
            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, and zigzag
                //

                for (int i = 0; i < 64; ++i)
                {
                    halfCoef[i] = quantize (
                        chanData[chan]->_dctData[i],
                        quantTable[i]);
                }

                toZigZag (halfZigCoef, halfCoef);

                //
                // Convert from NATIVE back to XDR, before we write out
                //
                priv_from_native16 (halfZigCoef, 64);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) internal_exr_free (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}